

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KReach.cpp
# Opt level: O0

void __thiscall KReach::cover(KReach *this,vertex_t v)

{
  bool bVar1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  reference puVar4;
  uint *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  uint *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vertex_t v_local;
  KReach *this_local;
  
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->degree_,(ulong)v);
  *pvVar2 = 0;
  pvVar3 = Graph::successors(this->graph_,v);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
  i = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&i);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->degree_,(ulong)*puVar4);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (&this->degree_,(ulong)*puVar4);
      *pvVar2 = *pvVar2 - 1;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  pvVar3 = Graph::predecessors(this->graph_,v);
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
  i_1 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&i_1);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->degree_,(ulong)*puVar4);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (&this->degree_,(ulong)*puVar4);
      *pvVar2 = *pvVar2 - 1;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void KReach::cover(vertex_t v) {
    degree_.at(v) = 0;
    for (const auto &i : graph_.successors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
    for (const auto &i : graph_.predecessors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
}